

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

KeyInfo * sqlite3KeyInfoOfIndex(Parse *pParse,Index *pIdx)

{
  uint N;
  CollSeq *local_48;
  char *zColl;
  KeyInfo *pKey;
  int nKey;
  int nCol;
  int i;
  Index *pIdx_local;
  Parse *pParse_local;
  
  N = (uint)pIdx->nColumn;
  if (pParse->nErr == 0) {
    if ((*(ushort *)&pIdx->field_0x63 >> 3 & 1) == 0) {
      zColl = (char *)sqlite3KeyInfoAlloc(pParse->db,N,0);
    }
    else {
      zColl = (char *)sqlite3KeyInfoAlloc(pParse->db,(uint)pIdx->nKeyCol,N - pIdx->nKeyCol);
    }
    if (zColl != (char *)0x0) {
      for (nKey = 0; nKey < (int)N; nKey = nKey + 1) {
        if (pIdx->azColl[nKey] == "BINARY") {
          local_48 = (CollSeq *)0x0;
        }
        else {
          local_48 = sqlite3LocateCollSeq(pParse,pIdx->azColl[nKey]);
        }
        *(CollSeq **)(zColl + (long)nKey * 8 + 0x20) = local_48;
        *(u8 *)(*(long *)(zColl + 0x18) + (long)nKey) = pIdx->aSortOrder[nKey];
      }
      if (pParse->nErr != 0) {
        if ((*(ushort *)&pIdx->field_0x63 >> 8 & 1) == 0) {
          *(ushort *)&pIdx->field_0x63 = *(ushort *)&pIdx->field_0x63 & 0xfeff | 0x100;
          pParse->rc = 0x201;
        }
        sqlite3KeyInfoUnref((KeyInfo *)zColl);
        zColl = (char *)0x0;
      }
    }
    pParse_local = (Parse *)zColl;
  }
  else {
    pParse_local = (Parse *)0x0;
  }
  return (KeyInfo *)pParse_local;
}

Assistant:

SQLITE_PRIVATE KeyInfo *sqlite3KeyInfoOfIndex(Parse *pParse, Index *pIdx){
  int i;
  int nCol = pIdx->nColumn;
  int nKey = pIdx->nKeyCol;
  KeyInfo *pKey;
  if( pParse->nErr ) return 0;
  if( pIdx->uniqNotNull ){
    pKey = sqlite3KeyInfoAlloc(pParse->db, nKey, nCol-nKey);
  }else{
    pKey = sqlite3KeyInfoAlloc(pParse->db, nCol, 0);
  }
  if( pKey ){
    assert( sqlite3KeyInfoIsWriteable(pKey) );
    for(i=0; i<nCol; i++){
      const char *zColl = pIdx->azColl[i];
      pKey->aColl[i] = zColl==sqlite3StrBINARY ? 0 :
                        sqlite3LocateCollSeq(pParse, zColl);
      pKey->aSortFlags[i] = pIdx->aSortOrder[i];
      assert( 0==(pKey->aSortFlags[i] & KEYINFO_ORDER_BIGNULL) );
    }
    if( pParse->nErr ){
      assert( pParse->rc==SQLITE_ERROR_MISSING_COLLSEQ );
      if( pIdx->bNoQuery==0 ){
        /* Deactivate the index because it contains an unknown collating
        ** sequence.  The only way to reactive the index is to reload the
        ** schema.  Adding the missing collating sequence later does not
        ** reactive the index.  The application had the chance to register
        ** the missing index using the collation-needed callback.  For
        ** simplicity, SQLite will not give the application a second chance.
        */
        pIdx->bNoQuery = 1;
        pParse->rc = SQLITE_ERROR_RETRY;
      }
      sqlite3KeyInfoUnref(pKey);
      pKey = 0;
    }
  }
  return pKey;
}